

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blackboard.h
# Opt level: O1

TypedData * blackboard_get(Blackboard *b,int id)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  int iVar3;
  undefined8 uVar4;
  _Base_ptr p_Var5;
  iterator __position;
  _Base_ptr p_Var6;
  
  if (b == (Blackboard *)0x0) {
    p_Var6 = (_Base_ptr)0x0;
  }
  else {
    iVar3 = pthread_mutex_lock((pthread_mutex_t *)b);
    if (iVar3 != 0) {
      uVar4 = std::__throw_system_error(iVar3);
      pthread_mutex_unlock((pthread_mutex_t *)b);
      _Unwind_Resume(uVar4);
    }
    p_Var1 = &(b->values)._M_t._M_impl.super__Rb_tree_header;
    p_Var2 = (b->values)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var5 = &p_Var1->_M_header;
    for (; p_Var2 != (_Base_ptr)0x0; p_Var2 = (&p_Var2->_M_left)[(int)p_Var2[1]._M_color < id]) {
      if (id <= (int)p_Var2[1]._M_color) {
        p_Var5 = p_Var2;
      }
    }
    __position._M_node = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var5 != p_Var1) &&
       (__position._M_node = p_Var5, id < (int)p_Var5[1]._M_color)) {
      __position._M_node = &p_Var1->_M_header;
    }
    if ((_Rb_tree_header *)__position._M_node == p_Var1) {
      p_Var6 = (_Base_ptr)0x0;
    }
    else {
      p_Var6 = __position._M_node[1]._M_parent;
      std::
      _Rb_tree<int,std::pair<int_const,TypedData*>,std::_Select1st<std::pair<int_const,TypedData*>>,std::less<int>,std::allocator<std::pair<int_const,TypedData*>>>
      ::erase_abi_cxx11_((_Rb_tree<int,std::pair<int_const,TypedData*>,std::_Select1st<std::pair<int_const,TypedData*>>,std::less<int>,std::allocator<std::pair<int_const,TypedData*>>>
                          *)&b->values,__position);
    }
    pthread_mutex_unlock((pthread_mutex_t *)b);
  }
  return (TypedData *)p_Var6;
}

Assistant:

TypedData* blackboard_get(Blackboard* b, int id)
{
    if (!b)
        return 0;

    std::lock_guard<std::mutex> lock(b->bb_mutex);
    auto it = b->values.find(id);
    if (it == b->values.end())
        return {};

    auto r = it->second;
    b->values.erase(it);
    return r;
}